

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void pybind11::detail::add_class_method(object *cls,char *name_,cpp_function *cf)

{
  handle obj;
  handle key;
  bool bVar1;
  int iVar2;
  handle local_60;
  handle local_58;
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>> local_50 [8]
  ;
  PyObject *local_48;
  handle local_40;
  handle local_38;
  
  cpp_function::name((cpp_function *)&local_58);
  key.m_ptr = local_58.m_ptr;
  obj.m_ptr = (cls->super_handle).m_ptr;
  local_58.m_ptr = (PyObject *)0x0;
  local_40.m_ptr = key.m_ptr;
  local_60.m_ptr = (PyObject *)0x0;
  local_38.m_ptr = (PyObject *)0x0;
  local_48 = obj.m_ptr;
  handle::dec_ref(&local_60);
  accessor_policies::obj_attr::set(obj,key,(cf->super_function).super_object.super_handle.m_ptr);
  handle::dec_ref(&local_38);
  handle::dec_ref(&local_40);
  handle::dec_ref(&local_58);
  iVar2 = strcmp(name_,"__eq__");
  if (iVar2 == 0) {
    local_48 = (cls->super_handle).m_ptr;
    local_40.m_ptr = (PyObject *)0x14b9de;
    local_38.m_ptr = (PyObject *)0x0;
    bVar1 = object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
            contains<char_const(&)[9]>(local_50,(char (*) [9])"__hash__");
    handle::dec_ref(&local_38);
    if (!bVar1) {
      local_60.m_ptr = (PyObject *)&_Py_NoneStruct;
      handle::inc_ref(&local_60);
      local_48 = (cls->super_handle).m_ptr;
      local_40.m_ptr = (PyObject *)0x14bd4b;
      local_38.m_ptr = (PyObject *)0x0;
      accessor_policies::str_attr::set((handle)local_48,"__hash__",local_60);
      handle::dec_ref(&local_38);
      handle::dec_ref(&local_60);
    }
  }
  return;
}

Assistant:

inline void add_class_method(object &cls, const char *name_, const cpp_function &cf) {
    cls.attr(cf.name()) = cf;
    if (std::strcmp(name_, "__eq__") == 0 && !cls.attr("__dict__").contains("__hash__")) {
        cls.attr("__hash__") = none();
    }
}